

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::PackUnorm2x16Case::PackUnorm2x16Case
          (PackUnorm2x16Case *this,Context *context,ShaderType shaderType,Precision precision)

{
  char *pcVar1;
  VarType local_188;
  allocator<char> local_169;
  string local_168;
  Symbol local_148;
  VarType local_110;
  allocator<char> local_f1;
  string local_f0;
  Symbol local_d0;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Precision local_20;
  ShaderType local_1c;
  Precision precision_local;
  ShaderType shaderType_local;
  Context *context_local;
  PackUnorm2x16Case *this_local;
  
  local_20 = precision;
  local_1c = shaderType;
  _precision_local = context;
  context_local = (Context *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"packunorm2x16",&local_81);
  pcVar1 = getPrecisionPostfix(local_20);
  std::operator+(&local_60,&local_80,pcVar1);
  pcVar1 = getShaderTypePostfix(local_1c);
  std::operator+(&local_40,&local_60,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  ShaderPackingFunctionCase::ShaderPackingFunctionCase
            (&this->super_ShaderPackingFunctionCase,context,pcVar1,"packUnorm2x16",local_1c);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__PackUnorm2x16Case_032c2e70;
  this->m_precision = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"in0",&local_f1);
  glu::VarType::VarType(&local_110,TYPE_FLOAT_VEC2,local_20);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_d0,&local_f0,&local_110);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back(&(this->super_ShaderPackingFunctionCase).m_spec.inputs,&local_d0);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_d0);
  glu::VarType::~VarType(&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"out0",&local_169);
  glu::VarType::VarType(&local_188,TYPE_UINT,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_148,&local_168,&local_188);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back(&(this->super_ShaderPackingFunctionCase).m_spec.outputs,&local_148);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_148);
  glu::VarType::~VarType(&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderPackingFunctionCase).m_spec.source,
             "out0 = packUnorm2x16(in0);");
  return;
}

Assistant:

PackUnorm2x16Case (Context& context, glu::ShaderType shaderType, glu::Precision precision)
		: ShaderPackingFunctionCase	(context, (string("packunorm2x16") + getPrecisionPostfix(precision) + getShaderTypePostfix(shaderType)).c_str(), "packUnorm2x16", shaderType)
		, m_precision				(precision)
	{
		m_spec.inputs.push_back(Symbol("in0", glu::VarType(glu::TYPE_FLOAT_VEC2, precision)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP)));

		m_spec.source = "out0 = packUnorm2x16(in0);";
	}